

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

bool __thiscall llbuild::basic::FileSystem::createDirectories(FileSystem *this,string *path)

{
  int iVar1;
  char *pcVar2;
  Style in_ECX;
  undefined1 uVar3;
  StringRef SVar4;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  iVar1 = (*this->_vptr_FileSystem[2])();
  uVar3 = 1;
  if ((char)iVar1 == '\0') {
    SVar4.Length = 2;
    SVar4.Data = (char *)path->_M_string_length;
    SVar4 = llvm::sys::path::parent_path((path *)(path->_M_dataplus)._M_p,SVar4,in_ECX);
    pcVar2 = SVar4.Data;
    if (SVar4.Length == 0) {
      uVar3 = 0;
    }
    else {
      local_40 = &local_30;
      if (pcVar2 == (char *)0x0) {
        local_38 = 0;
        local_30 = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,pcVar2,pcVar2 + SVar4.Length);
      }
      iVar1 = (*this->_vptr_FileSystem[3])(this,&local_40);
      if ((char)iVar1 == '\0') {
        uVar3 = 0;
      }
      else {
        iVar1 = (*this->_vptr_FileSystem[2])(this,path);
        uVar3 = (undefined1)iVar1;
      }
      if (local_40 != &local_30) {
        operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
      }
    }
  }
  return (bool)uVar3;
}

Assistant:

bool FileSystem::createDirectories(const std::string& path) {
  // Attempt to create the final directory first, to optimize for the common
  // case where we don't need to recurse.
  if (createDirectory(path))
    return true;

  // If that failed, attempt to create the parent.
  StringRef parent = llvm::sys::path::parent_path(path);
  if (parent.empty())
    return false;
  return createDirectories(parent) && createDirectory(path);
}